

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINAnalyzerResults.cpp
# Opt level: O0

void __thiscall
LINAnalyzerResults::GenerateExportFile
          (LINAnalyzerResults *this,char *file,DisplayBase display_base,U32 export_type_user_id)

{
  byte bVar1;
  uint uVar2;
  ulonglong uVar3;
  ostream *poVar4;
  ulong uVar5;
  bool bVar6;
  U64 data;
  ulong local_398;
  U64 j;
  U64 last_frame;
  U64 first_frame;
  U64 packet_id;
  Frame frame;
  ulonglong local_368;
  char local_358;
  ulong local_350;
  U64 i;
  U64 num_frames;
  U32 sample_rate;
  U64 trigger_sample;
  ofstream file_stream;
  char local_128 [8];
  char number_str [128];
  char time_str [128];
  U32 export_type_user_id_local;
  DisplayBase display_base_local;
  char *file_local;
  LINAnalyzerResults *this_local;
  
  std::ofstream::ofstream(&trigger_sample,file,_S_out);
  uVar3 = Analyzer::GetTriggerSample();
  uVar2 = Analyzer::GetSampleRate();
  poVar4 = std::operator<<((ostream *)&trigger_sample,
                           "T.BREAK,BREAK,T.SYNC,SYNC,T.PID,PID,T.D,Dn...");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  uVar5 = AnalyzerResults::GetNumFrames();
  for (local_350 = 0; local_350 < uVar5; local_350 = local_350 + 1) {
    AnalyzerResults::GetFrame((ulonglong)&packet_id);
    if ((local_358 == '\x01') &&
       (first_frame = AnalyzerResults::GetPacketContainingFrameSequential((ulonglong)this),
       (ulonglong *)first_frame != (ulonglong *)0xffffffffffffffff)) {
      AnalyzerResults::GetFramesContainedInPacket
                ((ulonglong)this,(ulonglong *)first_frame,&last_frame);
      for (local_398 = last_frame; local_398 <= j; local_398 = local_398 + 1) {
        AnalyzerResults::GetFrame((ulonglong)&data);
        memcpy(&packet_id,&data,0x22);
        Frame::~Frame((Frame *)&data);
        AnalyzerHelpers::GetTimeString(packet_id,uVar3,uVar2,number_str + 0x78,0x80);
        AnalyzerHelpers::GetNumberString(local_368,display_base,8,local_128,0x80);
        poVar4 = std::operator<<((ostream *)&trigger_sample,number_str + 0x78);
        poVar4 = std::operator<<(poVar4,",");
        std::operator<<(poVar4,local_128);
        if (local_398 < j) {
          std::operator<<((ostream *)&trigger_sample,",");
        }
      }
      std::ostream::operator<<((ostream *)&trigger_sample,std::endl<char,std::char_traits<char>>);
      local_350 = j;
    }
    bVar1 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,local_350);
    bVar6 = (bVar1 & 1) == 1;
    if (bVar6) {
      std::ofstream::close();
    }
    Frame::~Frame((Frame *)&packet_id);
    if (bVar6) goto LAB_001133e8;
  }
  AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,0);
  std::ofstream::close();
LAB_001133e8:
  std::ofstream::~ofstream(&trigger_sample);
  return;
}

Assistant:

void LINAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 export_type_user_id )
{
    char time_str[ 128 ];
    char number_str[ 128 ];
    std::ofstream file_stream( file, std::ios::out );

    U64 trigger_sample = mAnalyzer->GetTriggerSample();
    U32 sample_rate = mAnalyzer->GetSampleRate();

    file_stream << "T.BREAK,BREAK,T.SYNC,SYNC,T.PID,PID,T.D,Dn..." << std::endl;

    U64 num_frames = GetNumFrames();
    for( U64 i = 0; i < num_frames; i++ )
    {
        Frame frame = GetFrame( i );

        if( frame.mType == headerBreak )
        {
            U64 packet_id = GetPacketContainingFrameSequential( i );

            if( packet_id != INVALID_RESULT_INDEX )
            {
                U64 first_frame;
                U64 last_frame;

                GetFramesContainedInPacket( packet_id, &first_frame, &last_frame );
                // export header time
                for( U64 j = first_frame; j <= last_frame; ++j )
                {
                    frame = GetFrame( j );
                    if( frame.mType == 0 )
                        continue; // skip IBS frames.

                    U64 data = frame.mData1;
                    if( ( LINAnalyzerResults::tLINFrameState )frame.mType == LINAnalyzerResults::headerPID )
                        data = data & 0x3F; // trim the upper 2 bits from the PID frame during eport.

                    AnalyzerHelpers::GetTimeString( frame.mStartingSampleInclusive, trigger_sample, sample_rate, time_str, 128 );
                    AnalyzerHelpers::GetNumberString( data, display_base, 8, number_str, 128 );
                    file_stream << time_str << "," << number_str;
                    if( j < last_frame )
                        file_stream << ",";
                }

                file_stream << std::endl;

                i = last_frame;
            }
        }

        if( UpdateExportProgressAndCheckForCancel( i, num_frames ) == true )
        {
            file_stream.close();
            return;
        }
    }

    UpdateExportProgressAndCheckForCancel( 0, 0 );

    file_stream.close();
}